

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall slang::ast::DiagnosticVisitor::finalize(DiagnosticVisitor *this)

{
  Type **__x;
  bool bVar1;
  undefined1 uVar2;
  reference ppHVar3;
  InstanceBodySymbol *pIVar4;
  reference ppIVar5;
  Type **args;
  Type **__y;
  iterator ppTVar6;
  AttributeSymbol *this_00;
  Symbol *pSVar7;
  long in_RDI;
  AttributeSymbol *attr;
  iterator __end3_3;
  iterator __begin3_3;
  type *__range3_3;
  type *attrList;
  type *_;
  iterator __end2_1;
  iterator __begin2_1;
  flat_hash_map<const_void_*,_std::span<const_AttributeSymbol_*const>_> *__range2_1;
  GenericClassDefSymbol *symbol_1;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::GenericClassDefSymbol_*,_5UL> *__range2;
  Type *spec_1;
  iterator __end4_2;
  iterator __begin4_2;
  SmallVector<const_slang::ast::Type_*,_5UL> *__range4_2;
  Type *spec;
  _Iterator<false> __end4_1;
  _Iterator<false> __begin4_1;
  transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_symbols_ClassSymbols_h:223:47)>
  *__range4_1;
  GenericClassDefSymbol *symbol;
  iterator __end3_2;
  iterator __begin3_2;
  SmallVector<const_slang::ast::GenericClassDefSymbol_*,_5UL> *__range3_2;
  bool didSomething;
  SmallVector<const_slang::ast::Type_*,_5UL> toVisit;
  SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  visitedSpecs;
  InstanceSymbol *inst_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  *__range3_1;
  vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  vii;
  InstanceSymbol *inst;
  not_null<const_slang::ast::Symbol_*> *sym;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *__range4;
  HierarchicalReference *hierRef;
  iterator __end3;
  iterator __begin3;
  vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  *__range3;
  vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  hierarchicalAssignments;
  locator loc;
  size_t pos0;
  size_t hash;
  Type **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  _Iterator<false> *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  DiagnosticVisitor *in_stack_fffffffffffffb78;
  Symbol *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  *in_stack_fffffffffffffb90;
  vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  *in_stack_fffffffffffffbb8;
  vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  *in_stack_fffffffffffffbc0;
  GenericClassDefSymbol *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_3d8;
  type *local_3d0;
  type *local_3c8;
  type *local_3c0;
  reference local_3b8;
  undefined1 in_stack_fffffffffffffc50 [16];
  undefined1 in_stack_fffffffffffffc60 [16];
  AttributeSymbol *local_378;
  iterator local_358;
  GenericClassDefSymbol *local_340;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_338;
  GenericClassDefSymbol *local_320;
  undefined1 local_2e8 [8];
  transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_symbols_ClassSymbols_h:223:47)>
  *local_2e0;
  undefined1 *local_2d8;
  GenericClassDefSymbol *local_2d0;
  iterator local_2c8;
  iterator local_2c0;
  SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*> *local_2b8;
  byte local_2a9;
  SmallVectorBase<const_slang::ast::Type_*> local_2a8 [4];
  undefined1 local_220 [16];
  size_t local_210;
  ulong local_1f8;
  ulong local_1f0;
  InstanceSymbol *local_1e8;
  InstanceSymbol **local_1e0;
  __normal_iterator<const_slang::ast::InstanceSymbol_**,_std::vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>_>
  local_1d8;
  undefined1 *local_1d0;
  undefined1 local_1c8 [24];
  InstanceSymbol *local_1b0;
  reference local_198;
  Element *local_190;
  __normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
  local_188;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *local_180;
  HierarchicalReference *local_178;
  HierarchicalReference **local_170;
  __normal_iterator<const_slang::ast::HierarchicalReference_**,_std::vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>_>
  local_168;
  undefined1 *local_160;
  undefined1 local_158 [32];
  GenericClassDefSymbol **local_138;
  undefined1 *local_130;
  GenericClassDefSymbol **local_128;
  undefined1 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  Type **local_78;
  GenericClassDefSymbol **local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Type **local_10;
  undefined1 *local_8;
  
  bVar1 = std::
          vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
          ::empty((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                   *)in_stack_fffffffffffffb80);
  if (!bVar1) {
    *(undefined1 *)(in_RDI + 0x15) = 1;
    std::
    vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
    ::vector(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_160 = local_158;
    local_168._M_current =
         (HierarchicalReference **)
         std::
         vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
         ::begin((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                  *)in_stack_fffffffffffffb68);
    local_170 = (HierarchicalReference **)
                std::
                vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                ::end((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                       *)in_stack_fffffffffffffb68);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::HierarchicalReference_**,_std::vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>_>
                             ((__normal_iterator<const_slang::ast::HierarchicalReference_**,_std::vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                              (__normal_iterator<const_slang::ast::HierarchicalReference_**,_std::vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>_>
                               *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppHVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::HierarchicalReference_**,_std::vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>_>
                ::operator*(&local_168);
      local_178 = *ppHVar3;
      local_180 = &local_178->path;
      local_188._M_current =
           (Element *)
           std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>::
           begin((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
                 in_stack_fffffffffffffb68);
      local_190 = (Element *)
                  std::
                  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>::
                  end((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>
                       *)in_stack_fffffffffffffb78);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
                                 *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                (__normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_198 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
                    ::operator*(&local_188);
        pSVar7 = not_null<const_slang::ast::Symbol_*>::operator->
                           ((not_null<const_slang::ast::Symbol_*> *)0x54e9ab);
        if (pSVar7->kind == Instance) {
          not_null<const_slang::ast::Symbol_*>::operator->
                    ((not_null<const_slang::ast::Symbol_*> *)0x54e9d3);
          local_1b0 = Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x54e9ea);
          pIVar4 = InstanceSymbol::getCanonicalBody(local_1b0);
          if (pIVar4 != (InstanceBodySymbol *)0x0) {
            Symbol::visit<slang::ast::DiagnosticVisitor&>
                      (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
        ::operator++(&local_188);
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::HierarchicalReference_**,_std::vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>_>
      ::operator++(&local_168);
    }
    std::
    vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
    ::~vector((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
               *)in_stack_fffffffffffffb80);
  }
  while (bVar1 = std::
                 vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                 ::empty((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                          *)in_stack_fffffffffffffb80), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
    ::vector((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
              *)in_stack_fffffffffffffbc0,
             (vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
              *)in_stack_fffffffffffffbb8);
    std::
    vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
    ::clear((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
             *)0x54eaf9);
    local_1d0 = local_1c8;
    local_1d8._M_current =
         (InstanceSymbol **)
         std::
         vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
         ::begin((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                  *)in_stack_fffffffffffffb68);
    local_1e0 = (InstanceSymbol **)
                std::
                vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                ::end((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                       *)in_stack_fffffffffffffb68);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::InstanceSymbol_**,_std::vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>_>
                             ((__normal_iterator<const_slang::ast::InstanceSymbol_**,_std::vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                              (__normal_iterator<const_slang::ast::InstanceSymbol_**,_std::vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>_>
                               *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar5 = __gnu_cxx::
                __normal_iterator<const_slang::ast::InstanceSymbol_**,_std::vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>_>
                ::operator*(&local_1d8);
      local_1e8 = *ppIVar5;
      Symbol::visit<slang::ast::DiagnosticVisitor&>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      Compilation::checkVirtualIfaceInstance
                (in_stack_fffffffffffffc60._0_8_,in_stack_fffffffffffffc50._8_8_);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::InstanceSymbol_**,_std::vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>_>
      ::operator++(&local_1d8);
    }
    std::
    vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
    ::~vector((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
               *)in_stack_fffffffffffffb80);
  }
  SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  ::SmallSet((SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
              *)in_stack_fffffffffffffb80);
  SmallVector<const_slang::ast::Type_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Type_*,_5UL> *)0x54ebff);
  do {
    local_2a9 = 0;
    local_2b8 = (SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*> *)(in_RDI + 0xa8);
    local_2c0 = SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>::begin(local_2b8);
    local_2c8 = SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>::end(local_2b8);
    for (; local_2c0 != local_2c8; local_2c0 = local_2c0 + 1) {
      local_2d0 = *local_2c0;
      local_2e0 = GenericClassDefSymbol::specializations
                            ((GenericClassDefSymbol *)
                             CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      local_2d8 = local_2e8;
      std::ranges::
      transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
      ::begin((transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_symbols_ClassSymbols_h:223:47)>
               *)in_stack_fffffffffffffb90);
      std::ranges::
      transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
      ::end((transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_symbols_ClassSymbols_h:223:47)>
             *)in_stack_fffffffffffffb90);
      while (uVar2 = std::ranges::operator==
                               ((_Iterator<false> *)
                                CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68), ((uVar2 ^ 0xff) & 1) != 0) {
        in_stack_fffffffffffffbd8 =
             (GenericClassDefSymbol *)
             std::ranges::
             transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
             ::_Iterator<false>::operator*
                       ((_Iterator<false> *)
                        CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
        local_138 = &local_340;
        local_340 = in_stack_fffffffffffffbd8;
        local_320 = in_stack_fffffffffffffbd8;
        local_130 = local_220;
        local_128 = local_138;
        local_120 = local_220;
        local_70 = local_138;
        local_68 = local_220;
        args = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
               ::key_from<slang::ast::Type_const*>((Type **)0x54edac);
        local_78 = args;
        local_80 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                   ::hash_for<slang::ast::Type_const*>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                               *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                              (Type **)in_stack_fffffffffffffb68);
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                                   *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                  (size_t)in_stack_fffffffffffffb68);
        local_10 = local_78;
        local_20 = local_80;
        local_18 = local_88;
        local_8 = local_220;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_88);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<const_slang::ast::Type_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                     ::groups((table_arrays<const_slang::ast::Type_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                               *)0x54ee8e);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffb78,
                                CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<const_slang::ast::Type_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                       ::elements((table_arrays<const_slang::ast::Type_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                                   *)0x54eee7);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffb90 =
                   (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                    *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                              *)0x54ef37);
              __x = local_10;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                    ::key_from<slang::ast::Type_const*>((Type **)0x54ef61);
              bVar1 = std::equal_to<const_slang::ast::Type_*>::operator()
                                ((equal_to<const_slang::ast::Type_*> *)in_stack_fffffffffffffb90,__x
                                 ,__y);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
                ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                goto LAB_0054f068;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_fffffffffffffb8f =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                   (size_t)in_stack_fffffffffffffb68);
          if ((bool)in_stack_fffffffffffffb8f) {
            memset(&local_a0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
            ::table_locator(&local_a0);
            goto LAB_0054f068;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_210);
        } while (bVar1);
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
        ::table_locator(&local_a0);
LAB_0054f068:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_a0);
        if (bVar1) {
          local_b0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                     ::make_iterator((locator *)0x54f08a);
          local_b1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_338,&local_b0,&local_b1);
        }
        else if (local_1f0 < local_1f8) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
          ::unchecked_emplace_at<slang::ast::Type_const*>
                    (in_stack_fffffffffffffb90,
                     CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
                     (size_t)in_stack_fffffffffffffb80,(Type **)in_stack_fffffffffffffb78);
          local_c8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                     ::make_iterator((locator *)0x54f10c);
          local_e1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_338,&local_c8,local_e1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
                    ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                      *)CONCAT17(uVar2,in_stack_fffffffffffffbe0),(size_t)in_stack_fffffffffffffbd8,
                     args);
          local_f8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                     ::make_iterator((locator *)0x54f174);
          local_111[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_338,&local_f8,local_111);
        }
        if ((local_338.second & 1U) != 0) {
          SmallVectorBase<const_slang::ast::Type_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Type_*> *)
                     CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                     (Type **)in_stack_fffffffffffffb68);
        }
        std::ranges::
        transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
        ::_Iterator<false>::operator++
                  ((_Iterator<false> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70)
                  );
      }
      local_358 = SmallVectorBase<const_slang::ast::Type_*>::begin(local_2a8);
      ppTVar6 = SmallVectorBase<const_slang::ast::Type_*>::end(local_2a8);
      for (; local_358 != ppTVar6; local_358 = local_358 + 1) {
        Symbol::visit<slang::ast::DiagnosticVisitor&>
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        local_2a9 = 1;
      }
      SmallVectorBase<const_slang::ast::Type_*>::clear
                ((SmallVectorBase<const_slang::ast::Type_*> *)
                 CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    }
    if ((local_2a9 & 1) == 0) {
      local_378 = (AttributeSymbol *)
                  SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>::begin
                            ((SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*> *)
                             (in_RDI + 0xa8));
      this_00 = (AttributeSymbol *)
                SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>::end
                          ((SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*> *)
                           (in_RDI + 0xa8));
      for (; local_378 != this_00; local_378 = (AttributeSymbol *)&(local_378->super_Symbol).name) {
        pSVar7 = (Symbol *)
                 GenericClassDefSymbol::numSpecializations((GenericClassDefSymbol *)0x54f365);
        if (pSVar7 == (Symbol *)0x0) {
          in_stack_fffffffffffffb78 =
               (DiagnosticVisitor *)
               GenericClassDefSymbol::getInvalidSpecialization(in_stack_fffffffffffffbd8);
          Symbol::visit<slang::ast::DiagnosticVisitor&>(pSVar7,in_stack_fffffffffffffb78);
        }
      }
      boost::unordered::
      unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
      ::begin((unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
               *)0x54f3e2);
      boost::unordered::
      unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
      ::end((unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
             *)0x54f3ff);
      while (in_stack_fffffffffffffb77 =
                  boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                             (table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)in_stack_fffffffffffffb68), (bool)in_stack_fffffffffffffb77) {
        local_3b8 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
        local_3c0 = std::
                    get<0ul,void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>
                              ((pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                *)0x54f459);
        local_3d0 = std::
                    get<1ul,void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>
                              ((pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                *)0x54f46e);
        local_3c8 = local_3d0;
        local_3d8._M_current =
             (AttributeSymbol **)
             std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffffb68);
        std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
                  ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                   in_stack_fffffffffffffb78);
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                   *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                  (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
          ::operator*(&local_3d8);
          AttributeSymbol::getValue(this_00);
          __gnu_cxx::
          __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
          ::operator++(&local_3d8);
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      }
      SmallVector<const_slang::ast::Type_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Type_*,_5UL> *)0x54f526);
      SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
      ::~SmallSet((SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
                   *)0x54f533);
      return;
    }
  } while( true );
}

Assistant:

void finalize() {
        // Once everything has been visited, go back over and check things that might
        // have been influenced by visiting later symbols.

        // For all hierarchical assignments, make sure we actually visited their
        // target instances and didn't skip them due to caching.
        if (!compilation.hierarchicalAssignments.empty()) {
            disableCache = true;
            auto hierarchicalAssignments = compilation.hierarchicalAssignments;
            for (auto hierRef : hierarchicalAssignments) {
                // Walk the path and visit all instances we find that were previously cached.
                for (auto& [sym, _] : hierRef->path) {
                    if (sym->kind == SymbolKind::Instance) {
                        auto& inst = sym->as<InstanceSymbol>();
                        if (inst.getCanonicalBody() != nullptr)
                            inst.visit(*this);
                    }
                }
            }
        }

        // Check the validity of virtual interface assignments.
        while (!compilation.virtualInterfaceInstances.empty()) {
            auto vii = compilation.virtualInterfaceInstances;
            compilation.virtualInterfaceInstances.clear();

            for (auto inst : vii) {
                inst->visit(*this);
                compilation.checkVirtualIfaceInstance(*inst);
            }
        }

        // Visiting a specialization can trigger more specializations to be made for the
        // same or other generic classes, so we need to be careful here when iterating.
        SmallSet<const Type*, 8> visitedSpecs;
        SmallVector<const Type*> toVisit;
        bool didSomething;
        do {
            didSomething = false;
            for (auto symbol : genericClasses) {
                for (auto& spec : symbol->specializations()) {
                    if (visitedSpecs.emplace(&spec).second)
                        toVisit.push_back(&spec);
                }

                for (auto spec : toVisit) {
                    spec->visit(*this);
                    didSomething = true;
                }

                toVisit.clear();
            }
        } while (didSomething);

        // Go back over and find generic classes that were never instantiated
        // and force an empty one to make sure we collect all diagnostics that
        // don't depend on parameter values.
        for (auto symbol : genericClasses) {
            if (symbol->numSpecializations() == 0)
                symbol->getInvalidSpecialization().visit(*this);
        }

        // Visit all attributes and force their values to resolve.
        for (auto& [_, attrList] : compilation.attributeMap) {
            for (auto attr : attrList)
                attr->getValue();
        }
    }